

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O1

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int i_1;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  float *ptr;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int i;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  
  iVar1 = this->group;
  uVar8 = this->channels / iVar1;
  if (0 < (long)iVar1) {
    uVar14 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar3 = bottom_top_blob->data;
    uVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    lVar15 = 0;
    lVar12 = (((long)bottom_top_blob->d * uVar4 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
             uVar4) * uVar4;
    iVar2 = this->affine;
    uVar17 = (ulong)uVar8;
    uVar10 = (ulong)uVar14;
    fVar19 = 1.0 / (float)(int)(uVar8 * uVar14);
    do {
      lVar16 = sVar5 * uVar4 * lVar15 * (int)uVar8;
      fVar20 = 0.0;
      fVar21 = 0.0;
      if (0 < (int)uVar8) {
        uVar13 = 0;
        do {
          if (0 < (int)uVar14) {
            lVar18 = 0;
            uVar9 = uVar10;
            do {
              fVar21 = fVar21 + *(float *)((long)pvVar3 + lVar18 * 4 + lVar12 * uVar13 + lVar16);
              lVar18 = lVar18 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar17);
      }
      fVar21 = fVar21 * fVar19;
      if (0 < (int)uVar8) {
        fVar20 = 0.0;
        uVar13 = 0;
        do {
          if (0 < (int)uVar14) {
            lVar18 = 0;
            uVar9 = uVar10;
            do {
              fVar22 = *(float *)((long)pvVar3 + lVar18 * 4 + lVar12 * uVar13 + lVar16) - fVar21;
              fVar20 = fVar20 + fVar22 * fVar22;
              lVar18 = lVar18 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar17);
      }
      if (0 < (int)uVar8) {
        fVar20 = fVar20 * fVar19;
        pvVar6 = (this->gamma_data).data;
        pvVar7 = (this->beta_data).data;
        uVar13 = 0;
        do {
          if (iVar2 == 0) {
            fVar24 = this->eps + fVar20;
            auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar24));
            fVar22 = auVar23._0_4_;
            fVar22 = fVar22 * -0.5 * (fVar24 * fVar22 * fVar22 + -3.0);
            fVar24 = fVar22 * -fVar21;
          }
          else {
            lVar18 = uVar13 + (lVar15 * (int)uVar8 & 0xffffffffU);
            fVar24 = this->eps + fVar20;
            auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar24));
            fVar22 = auVar23._0_4_;
            fVar22 = fVar22 * -0.5 * (fVar24 * fVar22 * fVar22 + -3.0) *
                     *(float *)((long)pvVar6 + lVar18 * 4);
            fVar24 = *(float *)((long)pvVar7 + lVar18 * 4) - fVar22 * fVar21;
          }
          if (0 < (int)uVar14) {
            lVar18 = lVar12 * uVar13 + lVar16;
            lVar11 = 0;
            uVar9 = uVar10;
            do {
              *(float *)((long)pvVar3 + lVar11 * 4 + lVar18) =
                   *(float *)((long)pvVar3 + lVar11 * 4 + lVar18) * fVar22 + fVar24;
              lVar11 = lVar11 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar17);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar1);
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}